

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *v,uint weight)

{
  pair<crnlib::vec<16U,_float>,_unsigned_int> local_5c;
  
  vec<16U,_float>::vec(&local_5c.first,v);
  local_5c.second = weight;
  vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::push_back
            (&this->m_training_vecs,&local_5c);
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight)
        {
            m_training_vecs.push_back(std::make_pair(v, weight));
        }